

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O0

void __thiscall CTestResource_TestMSAA_Test::TestBody(CTestResource_TestMSAA_Test *this)

{
  __type _Var1;
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  GMM_MULTI_TILE_ARCH *pGVar7;
  TEST_RESOURCE_TYPE *pTVar8;
  TEST_BPP *pTVar9;
  __tuple_element_t<2UL,_tuple<int,_int,_int,_bool,_int,_int>_> *p_Var10;
  __tuple_element_t<3UL,_tuple<int,_int,_int,_bool,_int,_int>_> *p_Var11;
  uint32_t *puVar12;
  __tuple_element_t<5UL,_tuple<int,_int,_int,_bool,_int,_int>_> *p_Var13;
  GMM_RESOURCE_INFO *ResourceInfo;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint32_t local_1f4;
  long local_1f0;
  uint local_1a0;
  uint32_t ExpectedHeight_2;
  uint32_t ExpectedQPitch_2;
  uint32_t ExpectedPitch_2;
  GMM_RESOURCE_INFO *MCSResourceInfo;
  uint32_t ExpectedHeight_1;
  uint32_t ExpectedQPitch_1;
  uint32_t ExpectedPitch_1;
  uint32_t HeightMultiplier;
  uint32_t WidthMultiplier;
  uint32_t ExpectedHeight;
  uint32_t ExpectedQPitch;
  uint32_t ExpectedPitch;
  GMM_RESOURCE_INFO *MSSResourceInfo;
  __tuple_element_t<5UL,_tuple<int,_int,_int,_bool,_int,_int>_> local_160;
  uint32_t k;
  int ArrayIdx;
  int TestDimIdx;
  TEST_BPP TStack_150;
  bool IsRT;
  TEST_RESOURCE_TYPE ResType;
  TEST_BPP Bpp;
  TEST_TILE_TYPE Tiling;
  undefined1 local_140 [8];
  GMM_RESCREATE_PARAMS gmmParams;
  tuple<int,_int,_int,_bool,_int,_int> element;
  iterator __end1;
  iterator __begin1;
  vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  *__range1;
  undefined1 local_78 [4];
  int Size;
  vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  List;
  uint32_t ExpectedMCSBpp;
  uint32_t TileSize;
  uint32_t MCSVAlign;
  uint32_t MCSHAlign;
  uint32_t TileDimY;
  uint32_t TileDimX;
  uint32_t VAlign;
  uint32_t HAlign;
  uint32_t TestArraySize [2];
  uint32_t TestDimensions [3] [2];
  uint32_t MCSTileSize [1] [2];
  CTestResource_TestMSAA_Test *this_local;
  
  TestArraySize[0] = 0;
  TestArraySize[1] = 0;
  _VAlign = 0x700000001;
  std::
  vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  ::vector((vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
            *)local_78);
  BuildInputIterator((vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                      *)local_78,3,2,false);
  __end1 = std::
           vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
           ::begin((vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                    *)local_78);
  element.super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>._16_8_ =
       std::
       vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
       ::end((vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
              *)local_78);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::tuple<int,_int,_int,_bool,_int,_int>_*,_std::vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>_>
                                     *)&element.
                                        super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>.
                                        super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
                                        super__Head_base<1UL,_int,_false>), bVar4) {
    pGVar7 = (GMM_MULTI_TILE_ARCH *)
             __gnu_cxx::
             __normal_iterator<std::tuple<int,_int,_int,_bool,_int,_int>_*,_std::vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>_>
             ::operator*(&__end1);
    gmmParams.MultiTileArch = *pGVar7;
    element.super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>.
    super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.super__Tuple_impl<2UL,_int,_bool,_int,_int>.
    super__Tuple_impl<3UL,_bool,_int,_int>.super__Tuple_impl<4UL,_int,_int> =
         *(_Tuple_impl<4UL,_int,_int> *)(pGVar7 + 1);
    element.super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>.
    super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.super__Tuple_impl<2UL,_int,_bool,_int,_int>.
    _8_8_ = pGVar7[2];
    memset(local_140,0,0x80);
    _Bpp = (anon_struct_8_45_9b07292e_for_Gpu)((ulong)_Bpp & 0xffff000000000000);
    gmmParams.Flags.Gpu = _Bpp;
    pTVar8 = (TEST_RESOURCE_TYPE *)
             std::get<0ul,int,int,int,bool,int,int>
                       ((tuple<int,_int,_int,_bool,_int,_int> *)&gmmParams.MultiTileArch);
    ResType = *pTVar8;
    pTVar9 = (TEST_BPP *)
             std::get<1ul,int,int,int,bool,int,int>
                       ((tuple<int,_int,_int,_bool,_int,_int> *)&gmmParams.MultiTileArch);
    TStack_150 = *pTVar9;
    p_Var10 = std::get<2ul,int,int,int,bool,int,int>
                        ((tuple<int,_int,_int,_bool,_int,_int> *)&gmmParams.MultiTileArch);
    TestDimIdx = *p_Var10;
    p_Var11 = std::get<3ul,int,int,int,bool,int,int>
                        ((tuple<int,_int,_int,_bool,_int,_int> *)&gmmParams.MultiTileArch);
    ArrayIdx._3_1_ = *p_Var11 & 1;
    puVar12 = (uint32_t *)
              std::get<4ul,int,int,int,bool,int,int>
                        ((tuple<int,_int,_int,_bool,_int,_int> *)&gmmParams.MultiTileArch);
    k = *puVar12;
    p_Var13 = std::get<5ul,int,int,int,bool,int,int>
                        ((tuple<int,_int,_int,_bool,_int,_int> *)&gmmParams.MultiTileArch);
    local_160 = *p_Var13;
    List.
    super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x1000;
    if (((TestDimIdx == 1) && ((int)ResType < 3)) &&
       (((ArrayIdx._3_1_ & 1) != 0 ||
        ((ResType != TEST_RESOURCE_2D &&
         ((TStack_150 == TEST_BPP_16 || (TStack_150 == TEST_BPP_32)))))))) {
      CTestResource::SetTileFlag
                (&this->super_CTestResource,(GMM_RESCREATE_PARAMS *)local_140,ResType);
      CTestResource::SetResType
                (&this->super_CTestResource,(GMM_RESCREATE_PARAMS *)local_140,TestDimIdx);
      CTestResource::SetResGpuFlags
                (&this->super_CTestResource,(GMM_RESCREATE_PARAMS *)local_140,
                 (bool)(ArrayIdx._3_1_ & 1));
      CTestResource::SetResArraySize
                (&this->super_CTestResource,(GMM_RESCREATE_PARAMS *)local_140,(&VAlign)[local_160]);
      gmmParams.ExistingSysMemSize._4_1_ = 1;
      local_140._4_4_ = CTestResource::SetResourceFormat(&this->super_CTestResource,TStack_150);
      for (MSSResourceInfo._4_4_ = MSAA_2x; MSSResourceInfo._4_4_ < MSAA_16x;
          MSSResourceInfo._4_4_ = MSSResourceInfo._4_4_ + MSAA_2x) {
        CTestResource::GetAlignmentAndTileDimensionsForMSAA
                  (&this->super_CTestResource,TStack_150,(bool)(ArrayIdx._3_1_ & 1),ResType,
                   MSSResourceInfo._4_4_,&MCSHAlign,&MCSVAlign,&TileDimX,&TileDimY,
                   (uint32_t *)
                   &List.
                    super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&TileSize,&ExpectedMCSBpp);
        gmmParams._40_8_ = ZEXT48(TestDimensions[(long)(int)k + -1][0] * MCSHAlign + 1);
        gmmParams.field_6.BaseWidth = TestDimensions[(long)(int)k + -1][1] * MCSVAlign + 1;
        gmmParams.field_6.BaseWidth64._4_4_ = 1;
        _Var1 = std::pow<double,unsigned_int>(2.0,MSSResourceInfo._4_4_);
        gmmParams.Flags.Wa = SUB84((long)_Var1,0);
        gmmParams.Type._1_1_ = gmmParams.Type._1_1_ & 0x7f;
        gmmParams.Depth = 1;
        _ExpectedQPitch =
             (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,local_140);
        if (_ExpectedQPitch != (GMM_RESOURCE_INFO *)0x0) {
          CTestResource::VerifyResourceHAlign<true>
                    (&this->super_CTestResource,_ExpectedQPitch,TileDimX);
          CTestResource::VerifyResourceVAlign<true>
                    (&this->super_CTestResource,_ExpectedQPitch,TileDimY);
          if ((ArrayIdx._3_1_ & 1) == 0) {
            CTestResource::GetInterleaveMSSPattern
                      (&this->super_CTestResource,MSSResourceInfo._4_4_,&ExpectedPitch_1,
                       &ExpectedQPitch_1,(bool)(ArrayIdx._3_1_ & 1),TStack_150);
            if (ExpectedPitch_1 < 2) {
              local_1f0 = gmmParams._40_8_;
            }
            else {
              local_1f0 = (gmmParams._40_8_ + 1) - (gmmParams._40_8_ + 1 & 1);
            }
            gmmParams._40_8_ = local_1f0;
            uVar3 = gmmParams._40_8_;
            if (ExpectedQPitch_1 < 2) {
              local_1f4 = gmmParams.field_6.BaseWidth;
            }
            else {
              local_1f4 = (gmmParams.field_6.BaseWidth + 1) - (gmmParams.field_6.BaseWidth + 1 & 1);
            }
            gmmParams.field_6.BaseWidth = local_1f4;
            gmmParams.CpTag = (uint32_t)local_1f0;
            iVar15 = gmmParams.CpTag * ExpectedPitch_1;
            iVar5 = TileDimX - 1;
            uVar6 = -TileDimX;
            gmmParams._40_8_ = uVar3;
            dVar2 = pow(2.0,(double)TStack_150);
            iVar15 = MCSHAlign + (iVar5 + iVar15 & uVar6) * (int)(long)dVar2;
            iVar16 = gmmParams.CpTag * ExpectedPitch_1;
            iVar5 = TileDimX - 1;
            uVar6 = -TileDimX;
            dVar2 = pow(2.0,(double)TStack_150);
            uVar6 = ~((iVar5 + iVar16 & uVar6) * (int)(long)dVar2 + -1 + MCSHAlign & MCSHAlign - 1)
                    + iVar15;
            CTestResource::VerifyResourcePitch<true>
                      (&this->super_CTestResource,_ExpectedQPitch,uVar6);
            if (ResType != TEST_RESOURCE_1D) {
              CTestResource::VerifyResourcePitchInTiles<true>
                        (&this->super_CTestResource,_ExpectedQPitch,uVar6 / MCSHAlign);
            }
            uVar14 = (gmmParams.field_6.BaseWidth * ExpectedQPitch_1 + (TileDimY - 1)) -
                     (gmmParams.field_6.BaseWidth * ExpectedQPitch_1 + (TileDimY - 1) & TileDimY - 1
                     );
            if (1 < gmmParams.Depth) {
              CTestResource::VerifyResourceQPitch<true>
                        (&this->super_CTestResource,_ExpectedQPitch,(ulong)uVar14);
            }
            CTestResource::VerifyResourceSize<true>
                      (&this->super_CTestResource,_ExpectedQPitch,
                       (ulong)(List.
                               super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1 +
                               uVar6 * ((MCSVAlign - 1) + uVar14 * gmmParams.Depth & -MCSVAlign) &
                              -List.
                               super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
          }
          else {
            ExpectedHeight = 0;
            WidthMultiplier = 0;
            uVar6 = (TileDimX - 1) + gmmParams.CpTag;
            uVar14 = -TileDimX;
            dVar2 = pow(2.0,(double)TStack_150);
            iVar5 = MCSHAlign + (uVar6 & uVar14) * (int)(long)dVar2;
            uVar6 = (TileDimX - 1) + gmmParams.CpTag;
            uVar14 = -TileDimX;
            dVar2 = pow(2.0,(double)TStack_150);
            ExpectedHeight =
                 ~((uVar6 & uVar14) * (int)(long)dVar2 + -1 + MCSHAlign & MCSHAlign - 1) + iVar5;
            CTestResource::VerifyResourcePitch<true>
                      (&this->super_CTestResource,_ExpectedQPitch,ExpectedHeight);
            if (ResType != TEST_RESOURCE_1D) {
              CTestResource::VerifyResourcePitchInTiles<true>
                        (&this->super_CTestResource,_ExpectedQPitch,ExpectedHeight / MCSHAlign);
            }
            WidthMultiplier = (TileDimY - 1) + gmmParams.field_6.BaseWidth & -TileDimY;
            CTestResource::VerifyResourceQPitch<true>
                      (&this->super_CTestResource,_ExpectedQPitch,(ulong)WidthMultiplier);
            HeightMultiplier =
                 (MCSVAlign - 1) + WidthMultiplier * (int)gmmParams.Flags.Wa * gmmParams.Depth &
                 -MCSVAlign;
            CTestResource::VerifyResourceSize<true>
                      (&this->super_CTestResource,_ExpectedQPitch,
                       (ulong)(List.
                               super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1 +
                               ExpectedHeight * HeightMultiplier &
                              -List.
                               super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
          }
        }
        if (_ExpectedQPitch != (GMM_RESOURCE_INFO *)0x0) {
          gmmParams.Type._1_1_ = gmmParams.Type._1_1_ | 0x80;
          ResourceInfo = (GMM_RESOURCE_INFO *)
                         (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                                   (CommonULT::pGmmULTClientContext,local_140);
          CTestResource::VerifyResourceHAlign<true>
                    (&this->super_CTestResource,ResourceInfo,TileSize);
          CTestResource::VerifyResourceVAlign<true>
                    (&this->super_CTestResource,ResourceInfo,ExpectedMCSBpp);
          uVar6 = ((TileSize - 1) + gmmParams.CpTag & -TileSize) *
                  (int)List.
                       super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x7f & 0xffffff80;
          CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,ResourceInfo,uVar6);
          CTestResource::VerifyResourcePitchInTiles<true>
                    (&this->super_CTestResource,ResourceInfo,uVar6 / 0x80);
          local_1a0 = gmmParams.field_6.BaseWidth;
          if (1 < gmmParams.Depth) {
            local_1a0 = (ExpectedMCSBpp - 1) + gmmParams.field_6.BaseWidth & -ExpectedMCSBpp;
            CTestResource::VerifyResourceQPitch<true>
                      (&this->super_CTestResource,ResourceInfo,(ulong)local_1a0);
          }
          CTestResource::VerifyResourceSize<true>
                    (&this->super_CTestResource,ResourceInfo,
                     (ulong)(List.
                             super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1 +
                             uVar6 * (local_1a0 * gmmParams.Depth + 0x1f & 0xffffffe0) &
                            -List.
                             super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
          (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                    (CommonULT::pGmmULTClientContext,ResourceInfo);
        }
        (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                  (CommonULT::pGmmULTClientContext,_ExpectedQPitch);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::tuple<int,_int,_int,_bool,_int,_int>_*,_std::vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  ::~vector((vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
             *)local_78);
  return;
}

Assistant:

TEST_F(CTestResource, TestMSAA)
{
    enum MSAA_Samples
    {
        MSAA_None,
        MSAA_2x,
        MSAA_4x,
        MSAA_8x,
        MSAA_16x
    };

    const uint32_t MCSTileSize[1][2] = {128, 32}; //MCS is TileY

    //Gen8:No mip-map for MSAA (MSS and MCS), No 16x
    //No MSAA for YUV/compressed formats
    //Interleaved MSS (IMS) for Depth/Stencil. Arrayed MSS (CMS) for Color RT
    //QPitch exists for arrayed MSS - gives distance between slices
    //MSS (Arrayed): px_wL, px_hL = pixel width/height of single sample at Lod L
    //                 MSS width = px_wL, MSS height = NumSamples*px_hL
    //MSS (Interleaved): px_wL, px_hL = pixel width/height of single sample at Lod L
    // Samples         MSS width                MSS Height
    //   2x            4*ceil(px_wL/2)             px_hL
    //   4x            4*ceil(px_wL/2)           4*ceil(px_hL/2)
    //   8x            8*ceil(px_wL/2)           4*ceil(px_hL/2)
    //  16x            8*ceil(px_wL/2)           8*ceil(px_hL/2)
    //MCS (bpp): 2x/4x - bpp_8, 8x - bpp_32, 16x - bpp_64

    const uint32_t TestDimensions[3][2] = {
    {0, 0}, //1x1x1
    {1, 0}, //2 Tilesx1
    {1, 1}, //2 Tilesx 2
    };

    uint32_t TestArraySize[2] = {1, 7};

    uint32_t HAlign, VAlign, TileDimX, TileDimY, MCSHAlign, MCSVAlign, TileSize;
    uint32_t ExpectedMCSBpp;

    std::vector<std::tuple<int, int, int, bool, int, int>> List; //TEST_TILE_TYPE, TEST_BPP, TEST_RESOURCE_TYPE, Depth or RT, TestDimension index, TestArraySize index
    auto Size = BuildInputIterator(List, 3, 2, false);                  // Size of arrays TestDimensions, TestArraySize

    for(auto element : List)
    {
        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Flags.Info           = {0};

        TEST_TILE_TYPE     Tiling     = (TEST_TILE_TYPE)std::get<0>(element);
        TEST_BPP           Bpp        = (TEST_BPP)std::get<1>(element);
        TEST_RESOURCE_TYPE ResType    = (TEST_RESOURCE_TYPE)std::get<2>(element);
        bool               IsRT       = std::get<3>(element); // True for RT, False for Depth
        int                TestDimIdx = std::get<4>(element); //index into TestDimensions array
        int                ArrayIdx   = std::get<5>(element); //index into TestArraySize
        TileSize                      = GMM_KBYTE(4);

        //Discard un-supported Tiling/Res_type/bpp for this test
        if(ResType != TEST_RESOURCE_2D || Tiling > TEST_TILEY           //No 1D/3D/Cube. Supported 2D mip-maps/array
           || (!IsRT && (Tiling == TEST_TILEX ||
                         !(Bpp == TEST_BPP_16 || Bpp == TEST_BPP_32)))) //depth supported on 16bit, 32bit formats only
            continue;

        SetTileFlag(gmmParams, Tiling);
        SetResType(gmmParams, ResType);
        SetResGpuFlags(gmmParams, IsRT);
        SetResArraySize(gmmParams, TestArraySize[ArrayIdx]);

        gmmParams.NoGfxMemory = 1;
        gmmParams.Format      = SetResourceFormat(Bpp);
        for(uint32_t k = MSAA_2x; k < MSAA_16x; k++) //No 16x MSAA on Gen8
        {
            GetAlignmentAndTileDimensionsForMSAA(Bpp, IsRT, Tiling, (TEST_MSAA)k,
                                                 TileDimX, TileDimY, HAlign, VAlign,
                                                 ExpectedMCSBpp, MCSHAlign, MCSVAlign);

            gmmParams.BaseWidth64 = TestDimensions[TestDimIdx][0] * TileDimX + 0x1;
            gmmParams.BaseHeight  = TestDimensions[TestDimIdx][1] * TileDimY + 0x1;

            gmmParams.Depth           = 0x1; //2D Res_type with Depth > 1 doesn't fail, although Tex_cacl doesn't use it
            gmmParams.MSAA.NumSamples = static_cast<uint32_t>(pow((double)2, k));
            gmmParams.Flags.Gpu.MCS   = 0;
            gmmParams.ArraySize       = 1;

            //MSS surface
            GMM_RESOURCE_INFO *MSSResourceInfo;
            MSSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

            if(MSSResourceInfo)
            {
                VerifyResourceHAlign<true>(MSSResourceInfo, HAlign);
                VerifyResourceVAlign<true>(MSSResourceInfo, VAlign);
                if(IsRT) //Arrayed MSS
                {
                    uint32_t ExpectedPitch = 0, ExpectedQPitch = 0;
                    ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign) * (uint32_t)pow(2.0, Bpp), TileDimX); // Aligned width * bpp, aligned to TileWidth
                    VerifyResourcePitch<true>(MSSResourceInfo, ExpectedPitch);
                    if(Tiling != TEST_LINEAR)
                        VerifyResourcePitchInTiles<true>(MSSResourceInfo, ExpectedPitch / TileDimX);

                    //if (gmmParams.ArraySize > 1) - Arrayed MSS has QPitch
                    {
                        ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
                        VerifyResourceQPitch<true>(MSSResourceInfo, ExpectedQPitch);
                    }

                    uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.MSAA.NumSamples * gmmParams.ArraySize, TileDimY); //Align Height =ExpectedPitch * NumSamples * ExpectedQPitch, to Tile-Height
                    VerifyResourceSize<true>(MSSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize));
                }
                else // Interleaved MSS
                {
                    uint32_t WidthMultiplier, HeightMultiplier;
                    GetInterleaveMSSPattern((TEST_MSAA)k, WidthMultiplier, HeightMultiplier, IsRT, Bpp);
                    gmmParams.BaseWidth64 = WidthMultiplier > 1 ? GMM_ULT_ALIGN(gmmParams.BaseWidth64, 2) : gmmParams.BaseWidth64;
                    gmmParams.BaseHeight  = HeightMultiplier > 1 ? GMM_ULT_ALIGN(gmmParams.BaseHeight, 2) : gmmParams.BaseHeight;

                    uint32_t ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64 * WidthMultiplier, HAlign) * (uint32_t)pow(2.0, Bpp), TileDimX); //AlignedWidth*bpp, then align to Tile
                    VerifyResourcePitch<true>(MSSResourceInfo, ExpectedPitch);
                    if(Tiling != TEST_LINEAR)
                    {
                        VerifyResourcePitchInTiles<true>(MSSResourceInfo, ExpectedPitch / TileDimX); // 1 tileY wide
                    }

                    uint32_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight * HeightMultiplier, VAlign);
                    if(gmmParams.ArraySize > 1)
                    {
                        // it needs to be in VALign multiple
                        VerifyResourceQPitch<true>(MSSResourceInfo, ExpectedQPitch);
                    }
                    uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, TileDimY);            //Align Height = ExpectedQPitch*ArraySize, to Tile-Height
                    VerifyResourceSize<true>(MSSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize)); //ExpectedPitch *ExpectedHeight
                }
            }

            //No MCS surface if MSS creation failed
            if(MSSResourceInfo)
            {
                gmmParams.Flags.Gpu.MCS = 1;
                GMM_RESOURCE_INFO *MCSResourceInfo;
                MCSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

                VerifyResourceHAlign<true>(MCSResourceInfo, MCSHAlign); // MCS alignment same as basic RT alignment
                VerifyResourceVAlign<true>(MCSResourceInfo, MCSVAlign);

                uint32_t ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64, MCSHAlign) * ExpectedMCSBpp, MCSTileSize[0][0]); //AlignedWidth*bpp, then tile-alignment
                VerifyResourcePitch<true>(MCSResourceInfo, ExpectedPitch);
                VerifyResourcePitchInTiles<true>(MCSResourceInfo, ExpectedPitch / MCSTileSize[0][0]);

                uint32_t ExpectedQPitch = gmmParams.BaseHeight;
                if(gmmParams.ArraySize > 1)
                {
                    ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, MCSVAlign); //QPitch only for array
                    VerifyResourceQPitch<true>(MCSResourceInfo, ExpectedQPitch);
                }

                uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, MCSTileSize[0][1]);
                VerifyResourceSize<true>(MCSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize));

                pGmmULTClientContext->DestroyResInfoObject(MCSResourceInfo);
            } //MCS

            pGmmULTClientContext->DestroyResInfoObject(MSSResourceInfo);
        } //NumSamples = k
    }     //Iterate through all input tuples
}